

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O3

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this)

{
  IRKind IVar1;
  OpCode OVar2;
  undefined2 uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  IRType IVar9;
  OpndKind OVar10;
  undefined4 *puVar11;
  Type *ppBVar12;
  Instr *pIVar13;
  BranchInstr *pBVar14;
  byte bVar15;
  Type pBVar16;
  char *message;
  char *error;
  byte bVar17;
  uint lineNumber;
  Opnd *pOVar18;
  Instr *pIVar19;
  Instr *pIVar20;
  bool bVar21;
  undefined1 local_68 [8];
  Iterator __iter;
  
  if (DAT_015933b8 == '\x01') {
    bVar21 = (this->func->field_0x243 & 1) == 0;
  }
  else {
    bVar21 = false;
  }
  pIVar13 = this->func->m_headInstr;
  if (pIVar13 != (Instr *)0x0) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar17 = 0;
    do {
      pIVar20 = pIVar13->m_next;
      bVar7 = Lowerer::ValidOpcodeAfterLower(pIVar13,this->func);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,0x11,"(Lowerer::ValidOpcodeAfterLower(instr, this->func))",
                           "Lowerer::ValidOpcodeAfterLower(instr, this->func)");
        if (!bVar7) goto LAB_004026e9;
        *puVar11 = 0;
      }
      LowererMD::Legalize<true>(pIVar13,false);
      IVar1 = pIVar13->m_kind;
      if (IVar1 == InstrKindBranch) {
        if ((!bVar21) || (bVar17 != 0)) goto LAB_00402554;
        pIVar19 = pIVar13[1].m_next;
        OVar2 = pIVar13->m_opcode;
        if (OVar2 < ADD) {
          if ((OVar2 == Br) || (OVar2 == MultiBr)) goto LAB_004020ec;
        }
        else {
          bVar7 = LowererMD::IsUnconditionalBranch(pIVar13);
          if (bVar7) {
LAB_004020ec:
            if (pIVar13->m_kind != InstrKindBranch) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
              if (!bVar7) goto LAB_004026e9;
              *puVar11 = 0;
            }
            OVar2 = pIVar13->m_opcode;
            if (OVar2 < ADD) {
              if ((OVar2 != Br) && (OVar2 != MultiBr)) goto LAB_0040221b;
            }
            else {
              bVar7 = LowererMD::IsUnconditionalBranch(pIVar13);
              if (!bVar7) {
LAB_0040221b:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                   ,0x67,"(instr->AsBranchInstr()->IsUnconditional())",
                                   "instr->AsBranchInstr()->IsUnconditional()");
                if (!bVar7) goto LAB_004026e9;
                *puVar11 = 0;
              }
            }
            if (pIVar19 == (Instr *)0x0) {
              if (pIVar13->m_src1 == (Opnd *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                lineNumber = 0x86;
                error = "(instr->GetSrc1())";
                message = "instr->GetSrc1()";
                goto LAB_00402541;
              }
            }
            else if (((ulong)pIVar19[1].m_func & 0x22) == 2) {
              pIVar13 = pIVar13->m_prev;
              if ((this->func->field_0x242 & 0x40) != 0) {
                while (bVar7 = LowererMD::IsAssign(pIVar13), bVar7) {
                  pIVar13 = pIVar13->m_prev;
                }
              }
              OVar2 = pIVar13->m_opcode;
              if (OVar2 != DeletedNonHelperBranch) {
                if (pIVar13->m_kind == InstrKindBranch) {
                  if (OVar2 < ADD) {
                    if ((OVar2 != Br) && (OVar2 != MultiBr)) goto LAB_00402641;
                  }
                  else {
                    bVar7 = LowererMD::IsUnconditionalBranch(pIVar13);
                    if (!bVar7) {
LAB_00402641:
                      if (pIVar13->m_kind != InstrKindBranch) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        *puVar11 = 1;
                        bVar7 = Js::Throw::ReportAssert
                                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                           ,0x5e,"(this->IsBranchInstr())",
                                           "Bad call to AsBranchInstr()");
                        if (!bVar7) goto LAB_004026e9;
                        *puVar11 = 0;
                      }
                      if ((((ulong)pIVar13[1].m_next[1].m_func & 2) == 0) ||
                         (pBVar14 = IR::Instr::AsBranchInstr(pIVar13),
                         (pBVar14->m_branchTarget->field_0x78 & 0x20) != 0)) goto LAB_00402554;
                    }
                  }
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                lineNumber = 0x82;
                error = 
                "((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)))"
                ;
                message = 
                "(instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert))"
                ;
                goto LAB_00402541;
              }
            }
            goto LAB_00402554;
          }
        }
        if (((ulong)pIVar19[1].m_func & 0x22) == 2) {
          pIVar13 = IR::Instr::GetNextRealInstrOrLabel(pIVar13);
          if (((pIVar13->m_kind == InstrKindProfiledLabel) || (pIVar13->m_kind == InstrKindLabel))
             && (((ulong)pIVar13[1].m_func & 2) != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            lineNumber = 0x62;
            error = 
            "(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper))";
            message = 
            "!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper)";
LAB_00402541:
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,lineNumber,error,message);
            if (!bVar7) {
LAB_004026e9:
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            *puVar11 = 0;
          }
        }
      }
      else if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
        bVar15 = *(byte *)&pIVar13[1].m_func;
        bVar17 = (bVar15 & 2) >> 1;
        if ((bool)((bVar15 & 2) == 0 & bVar21)) {
          if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar7) goto LAB_004026e9;
            *puVar11 = 0;
            bVar15 = *(byte *)&pIVar13[1].m_func;
          }
          if ((bVar15 & 0x20) == 0) {
            if ((pIVar13->m_kind != InstrKindLabel) && (pIVar13->m_kind != InstrKindProfiledLabel))
            {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar7) goto LAB_004026e9;
              *puVar11 = 0;
            }
            bVar15 = 1;
            bVar7 = false;
            __iter.current = (NodeBase *)pIVar13;
            do {
              pIVar19 = pIVar13;
              local_68 = (undefined1  [8])(pIVar19 + 1);
              __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                            local_68;
              while( true ) {
                if (__iter.list ==
                    (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar11 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                     ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar8) goto LAB_004026e9;
                  *puVar11 = 0;
                }
                pIVar13 = (Instr *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next
                ;
                if ((undefined1  [8])pIVar13 == local_68) goto LAB_00401ed0;
                __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                              pIVar13;
                ppBVar12 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator
                           ::Data((Iterator *)local_68);
                pBVar16 = *ppBVar12;
                do {
                  pBVar16 = (Type)(pBVar16->super_Instr).m_prev;
                  if (pBVar16 == (Type)0x0) goto LAB_00401ecb;
                  IVar1 = (pBVar16->super_Instr).m_kind;
                } while ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel));
                if ((((ulong)pBVar16[1].super_Instr._vptr_Instr & 2) == 0) ||
                   ((*ppBVar12)->m_isHelperToNonHelperBranch == true)) break;
                bVar15 = 0;
              }
LAB_00401ecb:
              bVar15 = 0;
              bVar7 = true;
LAB_00401ed0:
              pIVar20 = pIVar19->m_next;
              if ((pIVar20->m_kind != InstrKindProfiledLabel) && (pIVar20->m_kind != InstrKindLabel)
                 ) goto LAB_00401f77;
              if (((this->func->field_0x242 & 0x80) == 0) &&
                 (((ulong)pIVar20[1].m_func & 0x22) == 2)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                   ,0x3a,
                                   "(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper)"
                                   ,
                                   "func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper"
                                  );
                if (!bVar8) goto LAB_004026e9;
                *puVar11 = 0;
              }
              pIVar13 = pIVar20;
            } while (((ulong)pIVar20[1].m_func & 2) == 0);
            pIVar20 = pIVar19->m_next;
LAB_00401f77:
            if ((!bVar7) &&
               (pIVar13 = IR::Instr::GetNextRealInstrOrLabel((Instr *)__iter.current),
               !(bool)(pIVar13->m_kind == InstrKindExit | bVar15))) {
              pIVar13 = IR::Instr::GetPrevRealInstrOrLabel(pIVar19);
              if (pIVar13->m_kind == InstrKindBranch) {
                OVar2 = pIVar13->m_opcode;
                if (OVar2 < ADD) {
                  if ((OVar2 != Br) && (OVar2 != MultiBr)) goto LAB_004025be;
                }
                else {
                  bVar7 = LowererMD::IsUnconditionalBranch(pIVar13);
                  if (!bVar7) goto LAB_004025be;
                }
              }
              else {
LAB_004025be:
                bVar7 = OpCodeAttr::HasFallThrough(pIVar13->m_opcode);
                if ((bVar7) &&
                   ((pIVar13->m_kind != InstrKindBranch ||
                    (*(char *)((long)&pIVar13[1]._vptr_Instr + 2) == '\0')))) {
                  do {
                    if ((pIVar13->m_kind == InstrKindLabel) ||
                       (pIVar13->m_kind == InstrKindProfiledLabel)) {
                      if (((ulong)pIVar13[1].m_func & 2) == 0) goto LAB_00402554;
                      break;
                    }
                    pIVar13 = pIVar13->m_prev;
                  } while (pIVar13 != (Instr *)0x0);
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar11 = 1;
                  lineNumber = 0x51;
                  error = 
                  "(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper)"
                  ;
                  message = "Inconsistency in Helper label annotations";
                  goto LAB_00402541;
                }
              }
            }
          }
          else {
            bVar17 = 0;
          }
        }
      }
      else {
        Check(this,pIVar13->m_dst);
        Check(this,pIVar13->m_src1);
        Check(this,pIVar13->m_src2);
        bVar7 = EncoderMD::IsOPEQ(pIVar13);
        if (bVar7) {
          bVar7 = IR::Opnd::IsEqual(pIVar13->m_dst,pIVar13->m_src1);
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x97,"(instr->GetDst()->IsEqual(instr->GetSrc1()))",
                               "instr->GetDst()->IsEqual(instr->GetSrc1())");
            if (!bVar7) goto LAB_004026e9;
            *puVar11 = 0;
          }
          if ((pIVar13->m_src2 != (Opnd *)0x0) &&
             (TySize[pIVar13->m_dst->m_type] != TySize[pIVar13->m_src2->m_type])) {
            bVar7 = EncoderMD::IsSHIFT(pIVar13);
            if ((bVar7) || (uVar3 = pIVar13->m_opcode, (ushort)(uVar3 - 0x3e1) < 3)) {
              pOVar18 = pIVar13->m_src2;
              IVar9 = pOVar18->m_type;
              if (TySize[IVar9] == 1) goto LAB_004023ee;
            }
            else {
              pOVar18 = pIVar13->m_src2;
              IVar9 = pOVar18->m_type;
            }
            if (((IVar9 == TyVar) && (TySize[pIVar13->m_dst->m_type] == 4)) &&
               (OVar10 = IR::Opnd::GetKind(pOVar18), OVar10 == OpndKindAddr)) {
              pOVar18 = pIVar13->m_src2;
              __iter.current = (NodeBase *)pIVar13;
              OVar10 = IR::Opnd::GetKind(pOVar18);
              if (OVar10 != OpndKindAddr) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
                if (!bVar7) goto LAB_004026e9;
                *puVar11 = 0;
              }
              pp_Var5 = pOVar18[2]._vptr_Opnd;
              pIVar13 = (Instr *)__iter.current;
              if ((_func_int **)(long)(int)pp_Var5 == pp_Var5) goto LAB_004023ee;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0xa0,
                               "(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))))"
                               ,
                               "!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address)))"
                              );
            if (!bVar7) goto LAB_004026e9;
            *puVar11 = 0;
          }
        }
LAB_004023ee:
        bVar7 = LowererMD::IsAssign(pIVar13);
        if ((bVar7) && (TySize[pIVar13->m_dst->m_type] != TySize[pIVar13->m_src1->m_type])) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xa7,
                             "(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())"
                             ,
                             "!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()"
                            );
          if (!bVar7) goto LAB_004026e9;
          *puVar11 = 0;
        }
        if (pIVar13->m_opcode - 0x3e6 < 0x10) {
          pOVar18 = pIVar13->m_dst;
          if (pIVar13->m_src2 == (Opnd *)0x0) {
            OVar10 = IR::Opnd::GetKind(pOVar18);
            if (OVar10 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar7) goto LAB_004026e9;
              *puVar11 = 0;
            }
            if (*(byte *)((long)&pOVar18[1].m_valueType.field_0.bits + 1) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              lineNumber = 0xc5;
              error = "(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG)";
              message = "instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG";
              goto LAB_00402541;
            }
          }
          else {
            bVar7 = IR::Opnd::IsEqual(pOVar18,pIVar13->m_src1);
            if (!bVar7) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              lineNumber = 0xc0;
              error = "(instr->GetDst()->IsEqual(instr->GetSrc1()))";
              message = "instr->GetDst()->IsEqual(instr->GetSrc1())";
              goto LAB_00402541;
            }
          }
        }
        else if ((pIVar13->m_opcode == CALL) &&
                (uVar4 = *(uint *)&pIVar13->m_func->field_0x240,
                -1 < (short)uVar4 && (uVar4 & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          lineNumber = 0xc9;
          error = "(!instr->m_func->IsTrueLeaf())";
          message = "!instr->m_func->IsTrueLeaf()";
          goto LAB_00402541;
        }
      }
LAB_00402554:
      pIVar13 = pIVar20;
    } while (pIVar20 != (Instr *)0x0);
  }
  return;
}

Assistant:

void
DbCheckPostLower::Check()
{
    bool doOpHelperCheck = Js::Configuration::Global.flags.CheckOpHelpers && !this->func->isPostLayout;
    bool isInHelperBlock = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        Assert(Lowerer::ValidOpcodeAfterLower(instr, this->func));
        LowererMD::Legalize</*verify*/true>(instr);
        switch(instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
            if (doOpHelperCheck && !isInHelperBlock && !instr->AsLabelInstr()->m_noHelperAssert)
            {
                bool foundNonHelperPath = false;
                bool isDeadLabel = true;

                IR::LabelInstr* labelInstr = instr->AsLabelInstr();

                while (1)
                {
                    FOREACH_SLIST_ENTRY(IR::BranchInstr *, branchInstr, &labelInstr->labelRefs)
                    {
                        isDeadLabel = false;
                        IR::Instr *instrPrev = branchInstr->m_prev;
                        while (instrPrev && !instrPrev->IsLabelInstr())
                        {
                            instrPrev = instrPrev->m_prev;
                        }
                        if (!instrPrev || !instrPrev->AsLabelInstr()->isOpHelper || branchInstr->m_isHelperToNonHelperBranch)
                        {
                            foundNonHelperPath = true;
                            break;
                        }
                    } NEXT_SLIST_ENTRY;

                    if (!labelInstr->m_next->IsLabelInstr())
                    {
                        break;
                    }
                    IR::LabelInstr *const nextLabel = labelInstr->m_next->AsLabelInstr();

                    // It is generally not expected for a non-helper label to be immediately followed by a helper label. Some
                    // special cases may flag the helper label with m_noHelperAssert = true. Peeps can cause non-helper blocks
                    // to fall through into helper blocks, so skip this check after peeps.
                    Assert(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper);

                    if(nextLabel->isOpHelper)
                    {
                        break;
                    }
                    labelInstr = nextLabel;
                }

                instrNext = labelInstr->m_next;

                // This label is unreachable or at least one path to it is not from a helper block.

                if (!foundNonHelperPath && !instr->GetNextRealInstrOrLabel()->IsExitInstr() && !isDeadLabel)
                {
                    IR::Instr *prevInstr = labelInstr->GetPrevRealInstrOrLabel();
                    if (prevInstr->HasFallThrough() && !(prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->m_isHelperToNonHelperBranch))
                    {
                        while (prevInstr && !prevInstr->IsLabelInstr())
                        {
                            prevInstr = prevInstr->m_prev;
                        }

                        AssertMsg(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper, "Inconsistency in Helper label annotations");
                    }
                }
            }
            break;
        }
        case IR::InstrKindBranch:
            if (doOpHelperCheck && !isInHelperBlock)
            {
                IR::LabelInstr *targetLabel = instr->AsBranchInstr()->GetTarget();

                // This branch needs a path to a non-helper block.
                if (instr->AsBranchInstr()->IsConditional())
                {
                    if (targetLabel->isOpHelper && !targetLabel->m_noHelperAssert)
                    {
                        IR::Instr *instrNextDebug = instr->GetNextRealInstrOrLabel();
                        Assert(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper));
                    }
                }
                else
                {
                    Assert(instr->AsBranchInstr()->IsUnconditional());

                    if (targetLabel)
                    {
                        if (!targetLabel->isOpHelper || targetLabel->m_noHelperAssert)
                        {
                            break;
                        }
                        // Target is opHelper

                        IR::Instr *instrPrev = instr->m_prev;

                        if (this->func->isPostRegAlloc)
                        {
                            while (LowererMD::IsAssign(instrPrev))
                            {
                                // Skip potential register allocation compensation code
                                instrPrev = instrPrev->m_prev;
                            }
                        }

                        if (instrPrev->m_opcode == Js::OpCode::DeletedNonHelperBranch)
                        {
                            break;
                        }

                        Assert((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional()
                            && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)));
                    }
                    else
                    {
                        Assert(instr->GetSrc1());
                    }
                }
            }
            break;

        default:
            this->Check(instr->GetDst());
            this->Check(instr->GetSrc1());
            this->Check(instr->GetSrc2());

#if defined(_M_IX86) || defined(_M_X64)
            // for op-eq's and assignment operators, make  sure the types match
            // for shift operators make sure the types match and the third is an 8-bit immediate
            // for cmp operators similarly check types are same
            if (EncoderMD::IsOPEQ(instr))
            {
                Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));

#if defined(_M_X64)
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BTS ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) ||
                    // Is src2 is TyVar and src1 is TyInt32/TyUint32, make sure the address fits in 32 bits 
                        (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 &&
                         instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))));
#else
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1));
#endif
            }
            Assert(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());
            Assert(instr->m_opcode != Js::OpCode::CMP || instr->GetSrc1()->GetType() == instr->GetSrc1()->GetType());

            switch (instr->m_opcode)
            {
            case Js::OpCode::CMOVA:
            case Js::OpCode::CMOVAE:
            case Js::OpCode::CMOVB:
            case Js::OpCode::CMOVBE:
            case Js::OpCode::CMOVE:
            case Js::OpCode::CMOVG:
            case Js::OpCode::CMOVGE:
            case Js::OpCode::CMOVL:
            case Js::OpCode::CMOVLE:
            case Js::OpCode::CMOVNE:
            case Js::OpCode::CMOVNO:
            case Js::OpCode::CMOVNP:
            case Js::OpCode::CMOVNS:
            case Js::OpCode::CMOVO:
            case Js::OpCode::CMOVP:
            case Js::OpCode::CMOVS:
                if (instr->GetSrc2())
                {
                    // CMOV inserted before regAlloc need a fake use of the dst register to make up for the
                    // fact that the CMOV may not set the dst. Regalloc needs to assign the same physical register for dst and src1.
                    Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));
                }
                else
                {
                    // These must have been inserted post-regalloc.
                    Assert(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG);
                }
                break;
            case Js::OpCode::CALL:
                Assert(!instr->m_func->IsTrueLeaf());
                break;
            }
#endif
        }
    } NEXT_INSTR_IN_FUNC_EDITING;
}